

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

bool duckdb_yyjson::unsafe_yyjson_mut_ptr_putx
               (yyjson_mut_val *val,char *ptr,size_t ptr_len,yyjson_mut_val *new_val,
               yyjson_mut_doc *doc,bool create_parent,bool insert_new,yyjson_ptr_ctx *ctx,
               yyjson_ptr_err *err)

{
  yyjson_val_pool *pyVar1;
  yyjson_str_pool *pyVar2;
  yyjson_alc *alc;
  byte *pbVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  yyjson_mut_val *next;
  yyjson_val_uni yVar9;
  long lVar10;
  yyjson_mut_val *pyVar11;
  yyjson_val_uni yVar12;
  byte *pbVar13;
  yyjson_mut_val *pyVar14;
  yyjson_mut_val *pyVar15;
  yyjson_mut_val *pyVar16;
  long lVar17;
  uint uVar18;
  byte *pbVar19;
  ulong uVar20;
  ulong uVar21;
  yyjson_mut_val *pyVar22;
  ulong uVar23;
  yyjson_mut_val *pyVar24;
  yyjson_mut_val *pyVar25;
  byte *pbVar26;
  yyjson_mut_val *pyVar27;
  long lVar28;
  ulong __n;
  byte *__s2;
  yyjson_mut_val *key;
  ulong *puVar29;
  ulong *puVar30;
  ulong uVar31;
  yyjson_mut_val *pyVar32;
  byte *pbVar33;
  yyjson_mut_val *pyVar34;
  bool bVar35;
  byte *pbStack_b0;
  byte local_99;
  ulong local_98;
  byte *local_38;
  
  pbVar19 = (byte *)(ptr + ptr_len);
  bVar7 = false;
  pbVar13 = (byte *)ptr;
  do {
    pyVar22 = val;
    __s2 = pbVar13 + 1;
    for (pbStack_b0 = (byte *)0x0;
        ((pbVar26 = __s2 + (long)pbStack_b0, pbVar26 < pbVar19 && (*pbVar26 != 0x2f)) &&
        (*pbVar26 != 0x7e)); pbStack_b0 = pbStack_b0 + 1) {
    }
    if ((pbVar26 != pbVar19) && (*pbVar26 == 0x7e)) {
      lVar10 = -(long)pbVar13;
      lVar28 = 0;
      pbStack_b0 = pbVar26;
      do {
        lVar17 = 1;
        pbVar26 = pbStack_b0;
        do {
          if ((pbVar19 <= pbVar26) || (bVar6 = *pbVar26, bVar6 == 0x2f)) {
            pbStack_b0 = pbStack_b0 + (lVar10 - lVar17);
            goto LAB_01b85682;
          }
          pbVar26 = pbVar26 + 1;
          lVar17 = lVar17 + -1;
        } while (bVar6 != 0x7e);
        if ((pbVar26 == pbVar19) || ((*pbVar26 & 0xfe) != 0x30)) {
          if (err == (yyjson_ptr_err *)0x0) {
            return false;
          }
          err->code = 2;
          err->msg = "invalid escaped character";
          err->pos = (size_t)(pbStack_b0 + (-lVar17 - (long)ptr));
          return false;
        }
        lVar28 = lVar28 + 1;
        lVar10 = lVar10 + -1;
        pbStack_b0 = pbVar26;
      } while( true );
    }
    lVar28 = 0;
LAB_01b85682:
    local_98 = pyVar22->tag;
    bVar6 = (byte)local_98 & 7;
    local_99 = bVar6;
    if (bVar6 == 6) {
      if (local_98 < 0x100) {
        local_99 = 6;
        if (pbStack_b0 == (byte *)0x1) {
          bVar7 = *__s2 == 0x2d || *__s2 == 0x30;
          pbStack_b0 = (byte *)0x1;
          goto LAB_01b858a2;
        }
      }
      else if ((byte *)0xffffffffffffffec < pbStack_b0 + -0x14) {
        pyVar11 = (yyjson_mut_val *)(pyVar22->uni).u64;
        if (*__s2 == 0x2d) {
          uVar23 = 0xffffffffffffffff;
LAB_01b8578f:
          if ((byte *)0x1 < pbStack_b0) goto LAB_01b85dde;
        }
        else {
          if (*__s2 == 0x30) {
            uVar23 = 0;
            goto LAB_01b8578f;
          }
          uVar23 = 0;
          for (pbVar13 = __s2; pbVar13 < __s2 + (long)pbStack_b0; pbVar13 = pbVar13 + 1) {
            if (9 < (ulong)*pbVar13 - 0x30) goto LAB_01b85dde;
            uVar23 = ((ulong)*pbVar13 - 0x30) + uVar23 * 10;
          }
          if (uVar23 == 0) {
            bVar7 = false;
            goto LAB_01b858a2;
          }
        }
        bVar7 = uVar23 == 0xffffffffffffffff || uVar23 == local_98 >> 8;
        if (local_98 >> 8 <= uVar23) goto LAB_01b858a2;
        while (bVar35 = uVar23 != 0, uVar23 = uVar23 - 1, pyVar14 = pyVar11, bVar35) {
          pyVar11 = pyVar11->next;
        }
        goto LAB_01b85812;
      }
LAB_01b85dde:
      local_99 = 6;
      bVar7 = false;
LAB_01b858a2:
      pyVar11 = (yyjson_mut_val *)0x0;
      val = (yyjson_mut_val *)0x0;
      if (pbVar26 != pbVar19) goto LAB_01b85f4a;
      val = (yyjson_mut_val *)0x0;
      pyVar24 = (yyjson_mut_val *)0x0;
      pyVar15 = (yyjson_mut_val *)0x0;
      pyVar14 = (yyjson_mut_val *)0x0;
      goto LAB_01b858c5;
    }
    if (((uint)local_98 & 7) != 7) goto joined_r0x01b86029;
    local_99 = 7;
    if (local_98 < 0x100) goto LAB_01b858a2;
    uVar23 = local_98 >> 8;
    pyVar14 = (yyjson_mut_val *)(pyVar22->uni).u64;
LAB_01b856cc:
    do {
      do {
        pyVar11 = pyVar14;
        bVar35 = uVar23 == 0;
        uVar23 = uVar23 - 1;
        if (bVar35) goto LAB_01b858a2;
        pyVar14 = pyVar11->next->next;
      } while ((byte *)(pyVar14->tag >> 8) != pbStack_b0);
      if (lVar28 != 0) {
        pbVar33 = (byte *)0x0;
        pbVar13 = __s2;
        do {
          if (pbStack_b0 == pbVar33) goto LAB_01b85812;
          bVar4 = *(byte *)((long)(pyVar14->uni).ptr + (long)pbVar33);
          if (*pbVar13 == 0x7e) {
            bVar5 = 0x2f;
            if (pbVar13[1] == 0x30) {
              bVar5 = 0x7e;
            }
            if (bVar5 != bVar4) goto LAB_01b856cc;
            pbVar13 = pbVar13 + 1;
          }
          else if (bVar4 != *pbVar13) goto LAB_01b856cc;
          pbVar13 = pbVar13 + 1;
          pbVar33 = pbVar33 + 1;
        } while( true );
      }
      iVar8 = bcmp((pyVar14->uni).ptr,__s2,(size_t)pbStack_b0);
    } while (iVar8 != 0);
LAB_01b85812:
    val = pyVar14->next;
  } while ((pbVar26 != pbVar19) && (pbVar13 = pbVar26, val != (yyjson_mut_val *)0x0));
  local_99 = bVar6;
  if (pbVar26 == pbVar19) {
    pyVar24 = (yyjson_mut_val *)0x0;
    pyVar15 = (yyjson_mut_val *)0x0;
    pyVar14 = (yyjson_mut_val *)0x0;
  }
  else {
LAB_01b85f4a:
    if (!create_parent) goto joined_r0x01b86029;
    if (local_99 == 6) {
      if ((insert_new & bVar7) == 0) goto joined_r0x01b86029;
      if (doc == (yyjson_mut_doc *)0x0) goto joined_r0x01b8655a;
      pyVar1 = &doc->val_pool;
      pyVar14 = (doc->val_pool).cur;
      if ((doc->val_pool).end == pyVar14) {
        bVar35 = unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
        if (!bVar35) goto joined_r0x01b8655a;
        pyVar14 = pyVar1->cur;
      }
      pyVar1->cur = pyVar14 + 1;
      if (pyVar14 == (yyjson_mut_val *)0x0) goto joined_r0x01b8655a;
      pyVar14->tag = 7;
      __s2 = pbVar26 + 1;
      for (pbStack_b0 = (byte *)0x0;
          ((pbVar13 = __s2 + (long)pbStack_b0, pbVar13 < pbVar19 && (*pbVar13 != 0x2f)) &&
          (*pbVar13 != 0x7e)); pbStack_b0 = pbStack_b0 + 1) {
      }
      local_99 = 7;
      pyVar15 = pyVar14;
      pyVar24 = pyVar22;
      if (pbVar13 == pbVar19) {
        lVar28 = 0;
LAB_01b86092:
        val = (yyjson_mut_val *)0x0;
        pbVar26 = pbVar13;
      }
      else {
        if (*pbVar13 == 0x7e) {
          uVar23 = ~(ulong)pbVar26;
          lVar28 = 0;
          do {
            pbStack_b0 = pbVar13 + uVar23;
            do {
              if ((pbVar19 <= pbVar13) || (bVar6 = *pbVar13, bVar6 == 0x2f)) goto LAB_01b86092;
              pbVar13 = pbVar13 + 1;
              pbStack_b0 = pbStack_b0 + 1;
            } while (bVar6 != 0x7e);
            if ((pbVar13 == pbVar19) || ((*pbVar13 & 0xfe) != 0x30)) {
              if (err == (yyjson_ptr_err *)0x0) {
                return false;
              }
              err->code = 3;
              err->msg = "JSON pointer cannot be resolved";
              err->pos = -(long)ptr;
              return false;
            }
            lVar28 = lVar28 + 1;
            uVar23 = uVar23 - 1;
          } while( true );
        }
        val = (yyjson_mut_val *)0x0;
        lVar28 = 0;
        pbVar26 = pbVar13;
      }
    }
    else {
      pyVar14 = (yyjson_mut_val *)0x0;
      pyVar24 = (yyjson_mut_val *)0x0;
      pyVar15 = pyVar22;
    }
    pyVar2 = &doc->str_pool;
    alc = &doc->alc;
    pyVar1 = &doc->val_pool;
    pyVar22 = pyVar15;
    pyVar15 = (yyjson_mut_val *)0x0;
LAB_01b860c1:
    pbVar13 = pbVar26;
    if (pbVar13 != pbVar19) {
      if (lVar28 == 0) {
        if (doc == (yyjson_mut_doc *)0x0) goto joined_r0x01b8655a;
        pyVar34 = (doc->val_pool).cur;
        if ((doc->val_pool).end == pyVar34) {
          bVar35 = unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
          if (bVar35) {
            pyVar34 = pyVar1->cur;
            goto LAB_01b86108;
          }
          pyVar34 = (yyjson_mut_val *)0x0;
        }
        else {
LAB_01b86108:
          pyVar1->cur = pyVar34 + 1;
        }
        local_38 = (byte *)(doc->str_pool).cur;
        if ((doc->str_pool).end + -(long)local_38 <= pbStack_b0) {
          bVar35 = unsafe_yyjson_str_pool_grow(pyVar2,alc,(usize)(pbStack_b0 + 1));
          if (!bVar35) goto joined_r0x01b8655a;
          local_38 = (byte *)pyVar2->cur;
        }
        pyVar2->cur = (char *)(pbStack_b0 + 1 + (long)local_38);
        if (local_38 == (byte *)0x0) goto joined_r0x01b8655a;
        switchD_016b0717::default(local_38,__s2,(size_t)pbStack_b0);
        local_38[(long)pbStack_b0] = 0;
      }
      else {
        pbVar26 = pbStack_b0 + lVar28;
        local_38 = (byte *)(doc->str_pool).cur;
        if ((doc->str_pool).end + -(long)local_38 <= pbVar26) {
          bVar35 = unsafe_yyjson_str_pool_grow(pyVar2,alc,(usize)(pbVar26 + 1));
          if (!bVar35) goto joined_r0x01b8655a;
          local_38 = (byte *)pyVar2->cur;
        }
        pyVar2->cur = (char *)(local_38 + (long)pbVar26 + 1);
        if (local_38 == (byte *)0x0) goto joined_r0x01b8655a;
        pbVar33 = __s2 + lVar28;
        pbVar26 = local_38;
        for (; __s2 < pbVar33 + (long)pbStack_b0; __s2 = __s2 + 1) {
          bVar6 = *__s2;
          if (bVar6 == 0x7e) {
            pbVar3 = __s2 + 1;
            __s2 = __s2 + 1;
            bVar6 = 0x2f;
            if (*pbVar3 == 0x30) {
              bVar6 = 0x7e;
            }
          }
          *pbVar26 = bVar6;
          pbVar26 = pbVar26 + 1;
        }
        *pbVar26 = 0;
        if (doc == (yyjson_mut_doc *)0x0) goto joined_r0x01b8655a;
        pyVar34 = (doc->val_pool).cur;
        if ((doc->val_pool).end == pyVar34) {
          bVar35 = unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
          if (!bVar35) goto joined_r0x01b8655a;
          pyVar34 = pyVar1->cur;
        }
        pyVar1->cur = pyVar34 + 1;
      }
      if (pyVar34 == (yyjson_mut_val *)0x0) goto joined_r0x01b8655a;
      pyVar34->tag = (long)pbStack_b0 << 8 | 5;
      (pyVar34->uni).ptr = local_38;
      pyVar16 = (doc->val_pool).cur;
      if ((doc->val_pool).end == pyVar16) {
        bVar35 = unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
        if (!bVar35) goto joined_r0x01b8655a;
        pyVar16 = pyVar1->cur;
      }
      pyVar1->cur = pyVar16 + 1;
      if (pyVar16 == (yyjson_mut_val *)0x0) goto joined_r0x01b8655a;
      pyVar16->tag = 7;
      pyVar25 = pyVar22;
      pyVar27 = pyVar16;
      pyVar32 = pyVar34;
      if (((pyVar24 != (yyjson_mut_val *)0x0) &&
          (uVar23 = pyVar22->tag, pyVar25 = pyVar24, pyVar27 = pyVar14, pyVar32 = pyVar15,
          (~(uint)uVar23 & 7) == 0)) && ((pyVar34->tag & 7) == 5)) {
        pyVar14 = pyVar34;
        if (0xff < uVar23) {
          lVar10 = *(long *)((pyVar22->uni).u64 + 0x10);
          pyVar14 = *(yyjson_mut_val **)(lVar10 + 0x10);
          *(yyjson_mut_val **)(lVar10 + 0x10) = pyVar34;
        }
        pyVar16->next = pyVar14;
        pyVar34->next = pyVar16;
        (pyVar22->uni).str = (char *)pyVar34;
        pyVar22->tag = (uVar23 & 0xff) + (uVar23 & 0xffffffffffffff00) + 0x100;
      }
      __s2 = pbVar13 + 1;
      for (pbStack_b0 = (byte *)0x0;
          ((pbVar26 = __s2 + (long)pbStack_b0, pbVar26 < pbVar19 && (*pbVar26 != 0x2f)) &&
          (*pbVar26 != 0x7e)); pbStack_b0 = pbStack_b0 + 1) {
      }
      lVar28 = 0;
      val = (yyjson_mut_val *)0x0;
      pyVar24 = pyVar25;
      pyVar22 = pyVar16;
      pyVar14 = pyVar27;
      pyVar15 = pyVar32;
      if (pbVar26 != pbVar19) {
        lVar28 = 0;
        val = (yyjson_mut_val *)0x0;
        if (*pbVar26 == 0x7e) {
          lVar10 = -(long)pbVar13;
          lVar28 = 0;
          do {
            lVar17 = 1;
            pbVar13 = pbVar26;
            do {
              if ((pbVar19 <= pbVar13) || (bVar6 = *pbVar13, bVar6 == 0x2f)) {
                pbStack_b0 = pbVar26 + (lVar10 - lVar17);
                val = (yyjson_mut_val *)0x0;
                pbVar26 = pbVar13;
                goto LAB_01b860c1;
              }
              pbVar13 = pbVar13 + 1;
              lVar17 = lVar17 + -1;
            } while (bVar6 != 0x7e);
            if ((pbVar13 == pbVar19) || ((*pbVar13 & 0xfe) != 0x30)) {
              if (err == (yyjson_ptr_err *)0x0) {
                return false;
              }
              err->code = 2;
              err->msg = "invalid escaped character";
              err->pos = (size_t)(pbVar26 + (-lVar17 - (long)ptr));
              return false;
            }
            lVar28 = lVar28 + 1;
            lVar10 = lVar10 + -1;
            pbVar26 = pbVar13;
          } while( true );
        }
      }
      goto LAB_01b860c1;
    }
    local_98 = pyVar22->tag;
  }
LAB_01b858c5:
  if (local_99 == 7) {
    if (ctx != (yyjson_ptr_ctx *)0x0) {
      ctx->ctn = pyVar22;
    }
    if (val == (yyjson_mut_val *)0x0 || insert_new) {
      if (lVar28 == 0) {
        if (doc == (yyjson_mut_doc *)0x0) goto joined_r0x01b8655a;
        pyVar1 = &doc->val_pool;
        yVar12 = (yyjson_val_uni)(doc->val_pool).cur;
        if ((doc->val_pool).end == (yyjson_mut_val *)yVar12.u64) {
          bVar7 = unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
          if (bVar7) {
            yVar12.str = (char *)pyVar1->cur;
            goto LAB_01b85932;
          }
          yVar12.u64 = 0;
        }
        else {
LAB_01b85932:
          pyVar1->cur = (yyjson_mut_val *)(yVar12.u64 + 0x18);
        }
        pyVar2 = &doc->str_pool;
        pbVar19 = (byte *)(doc->str_pool).cur;
        if ((doc->str_pool).end + -(long)pbVar19 <= pbStack_b0) {
          bVar7 = unsafe_yyjson_str_pool_grow(pyVar2,&doc->alc,(usize)(pbStack_b0 + 1));
          if (!bVar7) goto joined_r0x01b8655a;
          pbVar19 = (byte *)pyVar2->cur;
        }
        pyVar2->cur = (char *)(pbStack_b0 + 1 + (long)pbVar19);
        if (pbVar19 == (byte *)0x0) goto joined_r0x01b8655a;
        switchD_016b0717::default(pbVar19,__s2,(size_t)pbStack_b0);
        pbVar19[(long)pbStack_b0] = 0;
      }
      else {
        pbVar13 = pbStack_b0 + lVar28;
        pyVar2 = &doc->str_pool;
        pbVar19 = (byte *)(doc->str_pool).cur;
        if ((doc->str_pool).end + -(long)pbVar19 <= pbVar13) {
          bVar7 = unsafe_yyjson_str_pool_grow(pyVar2,&doc->alc,(usize)(pbVar13 + 1));
          if (!bVar7) goto joined_r0x01b8655a;
          pbVar19 = (byte *)pyVar2->cur;
        }
        pyVar2->cur = (char *)(pbVar13 + (long)pbVar19 + 1);
        if (pbVar19 == (byte *)0x0) goto joined_r0x01b8655a;
        pbVar26 = __s2 + lVar28;
        pbVar13 = pbVar19;
        for (; __s2 < pbVar26 + (long)pbStack_b0; __s2 = __s2 + 1) {
          bVar6 = *__s2;
          if (bVar6 == 0x7e) {
            pbVar33 = __s2 + 1;
            __s2 = __s2 + 1;
            bVar6 = 0x2f;
            if (*pbVar33 == 0x30) {
              bVar6 = 0x7e;
            }
          }
          *pbVar13 = bVar6;
          pbVar13 = pbVar13 + 1;
        }
        *pbVar13 = 0;
        if (doc == (yyjson_mut_doc *)0x0) goto joined_r0x01b8655a;
        pyVar1 = &doc->val_pool;
        yVar12 = (yyjson_val_uni)(doc->val_pool).cur;
        if ((doc->val_pool).end == (yyjson_mut_val *)yVar12.u64) {
          bVar7 = unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
          if (!bVar7) goto joined_r0x01b8655a;
          yVar12.str = (char *)pyVar1->cur;
        }
        pyVar1->cur = (yyjson_mut_val *)(yVar12.u64 + 0x18);
      }
      if (yVar12.u64 == 0) {
joined_r0x01b8655a:
        if (err == (yyjson_ptr_err *)0x0) {
          return false;
        }
        err->code = 6;
        err->msg = "failed to create value";
        err->pos = 0;
        return false;
      }
      *(ulong *)yVar12.str = (long)pbStack_b0 << 8 | 5;
      *(byte **)(yVar12.u64 + 8) = pbVar19;
      if (ctx != (yyjson_ptr_ctx *)0x0) {
        yVar9 = yVar12;
        if (0xff < local_98) {
          yVar9 = pyVar22->uni;
        }
        ctx->pre = (yyjson_mut_val *)yVar9;
      }
      yVar9 = yVar12;
      if (0xff < local_98) {
        lVar10 = *(long *)((pyVar22->uni).u64 + 0x10);
        yVar9 = *(yyjson_val_uni *)(lVar10 + 0x10);
        ((yyjson_val_uni *)(lVar10 + 0x10))->str = (char *)yVar12;
      }
      new_val->next = (yyjson_mut_val *)yVar9;
      *(yyjson_mut_val **)(yVar12.u64 + 0x10) = new_val;
      (pyVar22->uni).str = (char *)yVar12;
      lVar10 = (ulong)(byte)pyVar22->tag + (local_98 & 0xffffffffffffff00);
    }
    else {
      pyVar34 = pyVar11->next->next;
      if (ctx != (yyjson_ptr_ctx *)0x0) {
        ctx->pre = pyVar11;
        ctx->old = val;
      }
      if ((((~(uint)local_98 & 7) != 0) || (pyVar34 == (yyjson_mut_val *)0x0)) ||
         (((uint)pyVar34->tag & 7) != 5)) goto LAB_01b85d22;
      uVar23 = 0;
      puVar29 = (ulong *)0x0;
      if (0xff < local_98) {
        uVar23 = local_98 >> 8;
        puVar29 = (ulong *)(pyVar22->uni).u64;
      }
      __n = pyVar34->tag >> 8;
      bVar7 = false;
      uVar20 = 0;
      while (uVar21 = uVar20, puVar30 = puVar29, uVar20 = uVar21 + 1, uVar21 < uVar23) {
        uVar31 = puVar30[2];
        puVar29 = *(ulong **)(uVar31 + 0x10);
        if (puVar29 == (ulong *)0x0) break;
        if ((*puVar29 >> 8 == __n) &&
           (iVar8 = bcmp((void *)puVar29[1],(pyVar34->uni).ptr,__n), iVar8 == 0)) {
          pyVar11 = *(yyjson_mut_val **)(puVar29[2] + 0x10);
          if ((new_val == (yyjson_mut_val *)0x0) || (bVar7)) {
            if (uVar23 == uVar20) {
              (pyVar22->uni).str = (char *)puVar30;
              uVar31 = puVar30[2];
            }
            uVar23 = uVar23 - 1;
            local_98 = uVar23 * 0x100 | local_98 & 0xff;
            pyVar22->tag = local_98;
            *(yyjson_mut_val **)(uVar31 + 0x10) = pyVar11;
            puVar29 = puVar30;
            uVar20 = uVar21;
          }
          else {
            new_val->next = pyVar11;
            puVar29[2] = (ulong)new_val;
            bVar7 = true;
          }
        }
      }
      if (new_val == (yyjson_mut_val *)0x0 || bVar7) goto LAB_01b85d22;
      pyVar11 = pyVar34;
      if (uVar23 != 0) {
        lVar10 = *(long *)((pyVar22->uni).u64 + 0x10);
        pyVar11 = *(yyjson_mut_val **)(lVar10 + 0x10);
        *(yyjson_mut_val **)(lVar10 + 0x10) = pyVar34;
      }
      new_val->next = pyVar11;
      pyVar34->next = new_val;
      (pyVar22->uni).str = (char *)pyVar34;
      lVar10 = (local_98 & 0xff) + uVar23 * 0x100;
    }
    pyVar22->tag = lVar10 + 0x100;
    goto LAB_01b85d22;
  }
  if (ctx != (yyjson_ptr_ctx *)0x0) {
    if ((val == (yyjson_mut_val *)0x0) && (!bVar7)) goto joined_r0x01b86029;
    ctx->ctn = pyVar22;
  }
  if (insert_new) {
    if (val == (yyjson_mut_val *)0x0) {
      if (bVar7 == false) goto joined_r0x01b86029;
      if (ctx != (yyjson_ptr_ctx *)0x0) {
        yVar12 = (yyjson_val_uni)new_val;
        if (0xff < local_98) {
          yVar12 = pyVar22->uni;
        }
        ctx->pre = (yyjson_mut_val *)yVar12;
      }
      if ((new_val != (yyjson_mut_val *)0x0) && (((uint)local_98 & 7) == 6)) {
        pyVar22->tag = (local_98 & 0xfffffffffffffffe) + 0x100;
        pyVar11 = new_val;
        if (0xff < local_98) {
          pyVar11 = *(yyjson_mut_val **)((pyVar22->uni).u64 + 0x10);
          *(yyjson_mut_val **)((pyVar22->uni).u64 + 0x10) = new_val;
        }
        new_val->next = pyVar11;
        (pyVar22->uni).str = (char *)new_val;
      }
    }
    else {
      pyVar11->next = new_val;
      new_val->next = val;
      if (ctx != (yyjson_ptr_ctx *)0x0) {
        ctx->pre = pyVar11;
      }
      pyVar22->tag = local_98 + 0x100;
    }
    goto LAB_01b85d22;
  }
  if (val == (yyjson_mut_val *)0x0) {
joined_r0x01b86029:
    if (err != (yyjson_ptr_err *)0x0) {
      err->code = 3;
      err->msg = "JSON pointer cannot be resolved";
      err->pos = (long)__s2 - (long)ptr;
    }
    return false;
  }
  if (local_98 < 0x200) {
    new_val->next = new_val;
    pyVar11 = new_val;
LAB_01b85d12:
    (pyVar22->uni).str = (char *)new_val;
  }
  else {
    new_val->next = val->next;
    pyVar11->next = new_val;
    if ((yyjson_mut_val *)(pyVar22->uni).u64 == val) goto LAB_01b85d12;
  }
  if (ctx != (yyjson_ptr_ctx *)0x0) {
    ctx->pre = pyVar11;
    ctx->old = val;
  }
LAB_01b85d22:
  if (pyVar24 != (yyjson_mut_val *)0x0) {
    uVar23 = pyVar24->tag;
    uVar18 = (uint)uVar23 & 7;
    if (pyVar15 == (yyjson_mut_val *)0x0) {
      if ((pyVar14 != (yyjson_mut_val *)0x0) && (uVar18 == 6)) {
        pyVar24->tag = (uVar23 & 0xfffffffffffffffe) + 0x100;
        pyVar22 = pyVar14;
        if (0xff < uVar23) {
          pyVar22 = *(yyjson_mut_val **)((pyVar24->uni).u64 + 0x10);
          *(yyjson_mut_val **)((pyVar24->uni).u64 + 0x10) = pyVar14;
        }
        pyVar14->next = pyVar22;
        (pyVar24->uni).u64 = (uint64_t)pyVar14;
      }
    }
    else if (((uVar18 == 7) && ((pyVar15->tag & 7) == 5)) && (pyVar14 != (yyjson_mut_val *)0x0)) {
      pyVar22 = pyVar15;
      if (0xff < uVar23) {
        lVar10 = *(long *)((pyVar24->uni).u64 + 0x10);
        pyVar22 = *(yyjson_mut_val **)(lVar10 + 0x10);
        *(yyjson_mut_val **)(lVar10 + 0x10) = pyVar15;
      }
      pyVar14->next = pyVar22;
      pyVar15->next = pyVar14;
      (pyVar24->uni).str = (char *)pyVar15;
      pyVar24->tag = (uVar23 & 0xff) + (uVar23 & 0xffffffffffffff00) + 0x100;
    }
  }
  return true;
}

Assistant:

bool unsafe_yyjson_mut_ptr_putx(yyjson_mut_val *val,
                                const char *ptr, size_t ptr_len,
                                yyjson_mut_val *new_val,
                                yyjson_mut_doc *doc,
                                bool create_parent, bool insert_new,
                                yyjson_ptr_ctx *ctx,
                                yyjson_ptr_err *err) {

    const char *hdr = ptr, *end = ptr + ptr_len, *token;
    usize token_len, esc, ctn_len;
    yyjson_mut_val *ctn, *key, *pre = NULL;
    yyjson_mut_val *sep_ctn = NULL, *sep_key = NULL, *sep_val = NULL;
    yyjson_type ctn_type;
    bool idx_is_last = false;

    /* skip exist parent nodes */
    while (true) {
        token = ptr_next_token(&ptr, end, &token_len, &esc);
        if (unlikely(!token)) return_err_syntax(false, ptr - hdr);
        ctn = val;
        ctn_type = unsafe_yyjson_get_type(ctn);
        if (ctn_type == YYJSON_TYPE_OBJ) {
            val = ptr_mut_obj_get(ctn, token, token_len, esc, &pre);
        } else if (ctn_type == YYJSON_TYPE_ARR) {
            val = ptr_mut_arr_get(ctn, token, token_len, esc, &pre,
                                  &idx_is_last);
        } else return_err_resolve(false, token - hdr);
        if (!val) break;
        if (ptr == end) break; /* is last token */
    }

    /* create parent nodes if not exist */
    if (unlikely(ptr != end)) { /* not last token */
        if (!create_parent) return_err_resolve(false, token - hdr);

        /* add value at last index if container is array */
        if (ctn_type == YYJSON_TYPE_ARR) {
            if (!idx_is_last || !insert_new) {
                return_err_resolve(false, token - hdr);
            }
            val = yyjson_mut_obj(doc);
            if (!val) return_err_alloc(false);

            /* delay attaching until all operations are completed */
            sep_ctn = ctn;
            sep_key = NULL;
            sep_val = val;

            /* move to next token */
            ctn = val;
            val = NULL;
            ctn_type = YYJSON_TYPE_OBJ;
            token = ptr_next_token(&ptr, end, &token_len, &esc);
            if (unlikely(!token)) return_err_resolve(false, token - hdr);
        }

        /* container is object, create parent nodes */
        while (ptr != end) { /* not last token */
            key = ptr_new_key(token, token_len, esc, doc);
            if (!key) return_err_alloc(false);
            val = yyjson_mut_obj(doc);
            if (!val) return_err_alloc(false);

            /* delay attaching until all operations are completed */
            if (!sep_ctn) {
                sep_ctn = ctn;
                sep_key = key;
                sep_val = val;
            } else {
                yyjson_mut_obj_add(ctn, key, val);
            }

            /* move to next token */
            ctn = val;
            val = NULL;
            token = ptr_next_token(&ptr, end, &token_len, &esc);
            if (unlikely(!token)) return_err_syntax(false, ptr - hdr);
        }
    }

    /* JSON pointer is resolved, insert or replace target value */
    ctn_len = unsafe_yyjson_get_len(ctn);
    if (ctn_type == YYJSON_TYPE_OBJ) {
        if (ctx) ctx->ctn = ctn;
        if (!val || insert_new) {
            /* insert new key-value pair */
            key = ptr_new_key(token, token_len, esc, doc);
            if (unlikely(!key)) return_err_alloc(false);
            if (ctx) ctx->pre = ctn_len ? (yyjson_mut_val *)ctn->uni.ptr : key;
            unsafe_yyjson_mut_obj_add(ctn, key, new_val, ctn_len);
        } else {
            /* replace exist value */
            key = pre->next->next;
            if (ctx) ctx->pre = pre;
            if (ctx) ctx->old = val;
            yyjson_mut_obj_put(ctn, key, new_val);
        }
    } else {
        /* array */
        if (ctx && (val || idx_is_last)) ctx->ctn = ctn;
        if (insert_new) {
            /* append new value */
            if (val) {
                pre->next = new_val;
                new_val->next = val;
                if (ctx) ctx->pre = pre;
                unsafe_yyjson_set_len(ctn, ctn_len + 1);
            } else if (idx_is_last) {
                if (ctx) ctx->pre = ctn_len ?
                    (yyjson_mut_val *)ctn->uni.ptr : new_val;
                yyjson_mut_arr_append(ctn, new_val);
            } else {
                return_err_resolve(false, token - hdr);
            }
        } else {
            /* replace exist value */
            if (!val) return_err_resolve(false, token - hdr);
            if (ctn_len > 1) {
                new_val->next = val->next;
                pre->next = new_val;
                if (ctn->uni.ptr == val) ctn->uni.ptr = new_val;
            } else {
                new_val->next = new_val;
                ctn->uni.ptr = new_val;
                pre = new_val;
            }
            if (ctx) ctx->pre = pre;
            if (ctx) ctx->old = val;
        }
    }

    /* all operations are completed, attach the new components to the target */
    if (unlikely(sep_ctn)) {
        if (sep_key) yyjson_mut_obj_add(sep_ctn, sep_key, sep_val);
        else yyjson_mut_arr_append(sep_ctn, sep_val);
    }
    return true;
}